

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Writer::WriteData_EveryoneWrites
          (BP5Writer *this,BufferV *Data,bool SerializedWriters)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  byte in_DL;
  BufferV *in_RSI;
  long in_RDI;
  uint64_t nextWriterPos_1;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> DataVec;
  uint64_t nextWriterPos;
  MPIChain *a;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  allocator *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  TransportMan *in_stack_fffffffffffffe60;
  long local_180;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  unsigned_long *in_stack_fffffffffffffec0;
  Comm *in_stack_fffffffffffffec8;
  Comm *in_stack_fffffffffffffed0;
  allocator local_121;
  string *in_stack_fffffffffffffee0;
  allocator local_f1;
  string local_f0 [40];
  undefined8 local_c8;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> local_c0;
  allocator local_a1;
  string local_a0 [40];
  long local_78;
  allocator local_41;
  string local_40 [32];
  long local_20;
  byte local_11;
  BufferV *local_10;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x9d8) == 0) {
    local_180 = 0;
  }
  else {
    local_180 = __dynamic_cast(*(long *)(in_RDI + 0x9d8),&aggregator::MPIAggregator::typeinfo,
                               &aggregator::MPIChain::typeinfo,0);
  }
  local_20 = local_180;
  iVar2 = helper::Comm::Rank((Comm *)0xa83e5d);
  if (0 < iVar2) {
    in_stack_fffffffffffffe60 = (TransportMan *)(local_20 + 0x20);
    helper::Comm::Rank((Comm *)0xa83e95);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Chain token in BP5Writer::WriteData",&local_41);
    helper::Comm::Recv<unsigned_long>
              (in_stack_fffffffffffffed0,(unsigned_long *)in_stack_fffffffffffffec8,
               (size_t)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
               ,in_stack_fffffffffffffee0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  uVar4 = helper::PaddingToAlignOffset
                    (*(uint64_t *)(in_RDI + 0xc18),(ulong)*(uint *)(in_RDI + 0x1a4));
  *(uint64_t *)(in_RDI + 0xc18) = uVar4 + *(long *)(in_RDI + 0xc18);
  *(undefined8 *)(in_RDI + 0xc10) = *(undefined8 *)(in_RDI + 0xc18);
  if ((local_11 & 1) == 0) {
    in_stack_fffffffffffffe5c = helper::Comm::Rank((Comm *)0xa83fd5);
    iVar2 = helper::Comm::Size((Comm *)0xa83fed);
    if (in_stack_fffffffffffffe5c < iVar2 + -1) {
      lVar1 = *(long *)(in_RDI + 0xc18);
      uVar4 = adios2::format::BufferV::Size(local_10);
      local_78 = lVar1 + uVar4;
      iVar3 = (int)((ulong)(local_20 + 0x20) >> 0x20);
      in_stack_fffffffffffffe4c = helper::Comm::Rank((Comm *)0xa84054);
      in_stack_fffffffffffffe4c = in_stack_fffffffffffffe4c + 1;
      in_stack_fffffffffffffe50 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"Chain token in BP5Writer::WriteData",in_stack_fffffffffffffe50);
      helper::Comm::Isend<unsigned_long>
                (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,in_stack_fffffffffffffee0);
      helper::Comm::Req::~Req((Req *)0xa840da);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  uVar4 = adios2::format::BufferV::Size(local_10);
  *(uint64_t *)(in_RDI + 0xc18) = *(long *)(in_RDI + 0xc18) + uVar4;
  (*local_10->_vptr_BufferV[2])();
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::data
            ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)0xa841a6);
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::size(&local_c0);
  transportman::TransportMan::WriteFileAt
            (in_stack_fffffffffffffe60,
             (iovec *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (size_t)in_stack_fffffffffffffe50,
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),iVar3);
  if ((local_11 & 1) != 0) {
    iVar3 = helper::Comm::Rank((Comm *)0xa84206);
    iVar2 = helper::Comm::Size((Comm *)0xa8421d);
    if (iVar3 < iVar2 + -1) {
      local_c8 = *(undefined8 *)(in_RDI + 0xc18);
      helper::Comm::Rank((Comm *)0xa84263);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"Chain token in BP5Writer::WriteData",&local_f1);
      helper::Comm::Isend<unsigned_long>
                (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,in_stack_fffffffffffffee0);
      helper::Comm::Req::~Req((Req *)0xa842e4);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
  }
  iVar3 = helper::Comm::Size((Comm *)0xa84373);
  if (1 < iVar3) {
    iVar3 = helper::Comm::Rank((Comm *)0xa84397);
    iVar2 = helper::Comm::Size((Comm *)0xa843ae);
    if (iVar3 == iVar2 + -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffee0,"Final chain token in BP5Writer::WriteData",
                 &local_121);
      helper::Comm::Isend<unsigned_long>
                (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,in_stack_fffffffffffffee0);
      helper::Comm::Req::~Req((Req *)0xa84457);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
    iVar3 = helper::Comm::Rank((Comm *)0xa844cd);
    if (iVar3 == 0) {
      in_stack_fffffffffffffdc0 =
           (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)(local_20 + 0x20);
      helper::Comm::Size((Comm *)0xa84509);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffeb8,"Chain token in BP5Writer::WriteData",
                 (allocator *)&stack0xfffffffffffffeb7);
      helper::Comm::Recv<unsigned_long>
                (in_stack_fffffffffffffed0,(unsigned_long *)in_stack_fffffffffffffec8,
                 (size_t)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                 in_stack_fffffffffffffeb8,in_stack_fffffffffffffee0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
    }
  }
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
            (in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void BP5Writer::WriteData_EveryoneWrites(format::BufferV *Data, bool SerializedWriters)
{
    const aggregator::MPIChain *a = dynamic_cast<aggregator::MPIChain *>(m_Aggregator);

    // new step writing starts at offset m_DataPos on aggregator
    // others will wait for the position to arrive from the rank below

    if (a->m_Comm.Rank() > 0)
    {
        a->m_Comm.Recv(&m_DataPos, 1, a->m_Comm.Rank() - 1, 0,
                       "Chain token in BP5Writer::WriteData");
    }

    // align to PAGE_SIZE
    m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);
    m_StartDataPos = m_DataPos;

    if (!SerializedWriters && a->m_Comm.Rank() < a->m_Comm.Size() - 1)
    {
        /* Send the token before writing so everyone can start writing asap */
        uint64_t nextWriterPos = m_DataPos + Data->Size();
        a->m_Comm.Isend(&nextWriterPos, 1, a->m_Comm.Rank() + 1, 0,
                        "Chain token in BP5Writer::WriteData");
    }

    m_DataPos += Data->Size();
    std::vector<core::iovec> DataVec = Data->DataVec();
    m_FileDataManager.WriteFileAt(DataVec.data(), DataVec.size(), m_StartDataPos);

    if (SerializedWriters && a->m_Comm.Rank() < a->m_Comm.Size() - 1)
    {
        /* send token now, effectively serializing the writers in the chain */
        uint64_t nextWriterPos = m_DataPos;
        a->m_Comm.Isend(&nextWriterPos, 1, a->m_Comm.Rank() + 1, 0,
                        "Chain token in BP5Writer::WriteData");
    }

    if (a->m_Comm.Size() > 1)
    {
        // at the end, last rank sends back the final data pos to first rank
        // so it can update its data pos
        if (a->m_Comm.Rank() == a->m_Comm.Size() - 1)
        {
            a->m_Comm.Isend(&m_DataPos, 1, 0, 0, "Final chain token in BP5Writer::WriteData");
        }
        if (a->m_Comm.Rank() == 0)
        {
            a->m_Comm.Recv(&m_DataPos, 1, a->m_Comm.Size() - 1, 0,
                           "Chain token in BP5Writer::WriteData");
        }
    }
}